

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pocketsphinx.c
# Opt level: O0

int ps_process_raw(ps_decoder_t *ps,int16 *data,size_t n_samples,int no_search,int full_utt)

{
  int iVar1;
  int local_34;
  int nfr;
  int n_searchfr;
  int full_utt_local;
  int no_search_local;
  size_t n_samples_local;
  int16 *data_local;
  ps_decoder_t *ps_local;
  
  local_34 = 0;
  _full_utt_local = n_samples;
  n_samples_local = (size_t)data;
  data_local = (int16 *)ps;
  if (ps->acmod->state == '\0') {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/pocketsphinx.c"
            ,0x4ce,"Failed to process data, utterance is not started. Use start_utt to start it\n");
    ps_local._4_4_ = 0;
  }
  else {
    if (no_search != 0) {
      acmod_set_grow(ps->acmod,1);
    }
    while (_full_utt_local != 0) {
      iVar1 = acmod_process_raw(*(acmod_t **)(data_local + 8),(int16 **)&n_samples_local,
                                (size_t *)&full_utt_local,full_utt);
      if (iVar1 < 0) {
        return iVar1;
      }
      if (no_search == 0) {
        iVar1 = ps_search_forward((ps_decoder_t *)data_local);
        if (iVar1 < 0) {
          return iVar1;
        }
        local_34 = iVar1 + local_34;
      }
    }
    ps_local._4_4_ = local_34;
  }
  return ps_local._4_4_;
}

Assistant:

int
ps_process_raw(ps_decoder_t *ps,
               int16 const *data,
               size_t n_samples,
               int no_search,
               int full_utt)
{
    int n_searchfr = 0;

    if (ps->acmod->state == ACMOD_IDLE) {
	E_ERROR("Failed to process data, utterance is not started. Use start_utt to start it\n");
	return 0;
    }

    if (no_search)
        acmod_set_grow(ps->acmod, TRUE);

    while (n_samples) {
        int nfr;

        /* Process some data into features. */
        if ((nfr = acmod_process_raw(ps->acmod, &data,
                                     &n_samples, full_utt)) < 0)
            return nfr;

        /* Score and search as much data as possible */
        if (no_search)
            continue;
        if ((nfr = ps_search_forward(ps)) < 0)
            return nfr;
        n_searchfr += nfr;
    }

    return n_searchfr;
}